

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::KcpTcpEventLoop::handleKcpMessage(KcpTcpEventLoop *this)

{
  bool bVar1;
  element_type *peVar2;
  KcpTcpEventLoop *this_local;
  
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_curKcpConn);
  if (!bVar1) {
    __assert_fail("m_curKcpConn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                  ,0xee,"void sznet::net::KcpTcpEventLoop::handleKcpMessage()");
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_curTcpConn);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_curKcpConn);
    bVar1 = KcpConnection::connecting(peVar2);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_curKcpConn);
      KcpConnection::connectEstablished(peVar2);
    }
    peVar2 = std::
             __shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_curKcpConn);
    KcpConnection::handleKcpMessage(peVar2,&this->m_inputBuffer);
    return;
  }
  __assert_fail("m_curTcpConn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                ,0xef,"void sznet::net::KcpTcpEventLoop::handleKcpMessage()");
}

Assistant:

void KcpTcpEventLoop::handleKcpMessage()
{
	assertInLoopThread();
	assert(m_curKcpConn);
	assert(m_curTcpConn);
	if (m_curKcpConn->connecting())
	{
		// 说明第一哦
		m_curKcpConn->connectEstablished();
	}
	m_curKcpConn->handleKcpMessage(m_inputBuffer);
}